

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O0

void AlphaVectorPruning::RemoveFirstOccurrence(ValueFunctionPOMDPDiscrete *V,AlphaVector *alpha)

{
  bool bVar1;
  iterator __position;
  __normal_iterator<const_AlphaVector_*,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>
  *in_RSI;
  __normal_iterator<AlphaVector_*,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *in_RDI;
  iterator it;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_AlphaVector_*,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>
  *in_stack_ffffffffffffffc0;
  AlphaVector *in_stack_ffffffffffffffd0;
  __normal_iterator<AlphaVector_*,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> local_18
  ;
  __normal_iterator<const_AlphaVector_*,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>
  *local_10;
  __normal_iterator<AlphaVector_*,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *local_8
  ;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  __gnu_cxx::
  __normal_iterator<AlphaVector_*,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::
  __normal_iterator(&local_18);
  local_18._M_current =
       (AlphaVector *)
       std::vector<AlphaVector,_std::allocator<AlphaVector>_>::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    __position = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::end
                           (in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<AlphaVector_*,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<AlphaVector_*,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) {
      return;
    }
    in_stack_ffffffffffffffc0 = local_10;
    __gnu_cxx::
    __normal_iterator<AlphaVector_*,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::
    operator*(&local_18);
    bVar1 = AlphaVector::Equal(__position._M_current,in_stack_ffffffffffffffd0);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<AlphaVector_*,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::
    operator++(&local_18);
  }
  __gnu_cxx::
  __normal_iterator<AlphaVector_const*,std::vector<AlphaVector,std::allocator<AlphaVector>>>::
  __normal_iterator<AlphaVector*>(in_stack_ffffffffffffffc0,local_8);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::erase
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_ffffffffffffffd0,
             (const_iterator)__position._M_current);
  return;
}

Assistant:

void AlphaVectorPruning::RemoveFirstOccurrence(ValueFunctionPOMDPDiscrete &V,
                                               const AlphaVector &alpha)
{
    ValueFunctionPOMDPDiscrete::iterator it;
    for(it=V.begin();it!=V.end();++it)
        if(alpha.Equal(*it))
        {
            V.erase(it);
            return;
        }
}